

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthRobots.cpp
# Opt level: O1

void rand_pos(int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int quad [4];
  int local_48 [6];
  
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  if (0 < n) {
    uVar5 = 0;
    do {
      iVar1 = rand();
      iVar1 = iVar1 % 4;
      lVar4 = (long)iVar1;
      if (local_48[lVar4] != 0) {
        while (local_48[lVar4] != 0) {
          iVar1 = iVar1 + 1;
          if (iVar1 == 4) {
            iVar1 = 0;
          }
          lVar4 = (long)iVar1;
        }
      }
      local_48[lVar4] = 1;
      iVar2 = rand();
      iVar2 = (iVar1 - (iVar1 - (iVar1 >> 0x1f) & 0x1ffffffeU)) * 5000 + iVar2 % 5000;
      robots[uVar5].x = iVar2;
      robots[uVar5].org_x = iVar2;
      iVar3 = rand();
      iVar2 = iVar3 % 5000 + 5000;
      if (1 < iVar1) {
        iVar2 = iVar3 % 5000;
      }
      robots[uVar5].y = iVar2;
      robots[uVar5].org_y = iVar2;
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)n);
  }
  return;
}

Assistant:

void rand_pos(int n)
{
	int i, k;
	int quad[4];

	for (i = 0; i < 4; i++) {
		quad[i] = 0;
	}

	/* get a new quadrant */
	for (i = 0; i < n; i++) {
		k = rand() % 4;
		if (quad[k] == 0)
			quad[k] = 1;
		else {
			while (quad[k] != 0) {
				if (++k == 4)
					k = 0;
			}
			quad[k] = 1;
		}
		robots[i].org_x = robots[i].x =
			(rand() % (MAX_X * CLICK / 2)) + ((MAX_X * CLICK / 2) * (k % 2));
		robots[i].org_y = robots[i].y =
			(rand() % (MAX_Y * CLICK / 2)) + ((MAX_Y * CLICK / 2) * (k<2));
	}
}